

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O0

vector<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_> *
MILBlob::UnPackSubByteVecImpl<MILBlob::UInt1>
          (vector<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vec,size_t numElements)

{
  type tVar1;
  size_type sVar2;
  size_t sVar3;
  invalid_argument *this;
  uchar *p;
  reference pvVar4;
  size_t local_50;
  size_t i;
  Span<MILBlob::UInt1,_18446744073709551615UL> subByteSpan;
  allocator<MILBlob::UInt1> local_22;
  undefined1 local_21;
  size_t local_20;
  size_t numElements_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vec_local;
  vector<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_> *ret;
  
  local_21 = 0;
  local_20 = numElements;
  numElements_local = (size_t)vec;
  vec_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  std::allocator<MILBlob::UInt1>::allocator(&local_22);
  std::vector<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_>::vector
            (__return_storage_ptr__,numElements,&local_22);
  std::allocator<MILBlob::UInt1>::~allocator(&local_22);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)numElements_local);
  sVar3 = SizeInBytes<MILBlob::UInt1>(local_20);
  if (sVar2 == sVar3) {
    p = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)numElements_local);
    Util::Span<MILBlob::UInt1,_18446744073709551615UL>::Span<18446744073709551615UL,_0>
              ((Span<MILBlob::UInt1,_18446744073709551615UL> *)&i,p,local_20);
    for (local_50 = 0; local_50 < local_20; local_50 = local_50 + 1) {
      tVar1 = Util::Span<MILBlob::UInt1,_18446744073709551615UL>::ValueAt
                        ((Span<MILBlob::UInt1,_18446744073709551615UL> *)&i,local_50);
      pvVar4 = std::vector<MILBlob::UInt1,_std::allocator<MILBlob::UInt1>_>::operator[]
                         (__return_storage_ptr__,local_50);
      pvVar4->data = tVar1.data;
    }
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this,
             "Unpacking to sub-byte type vector has invalid number of elements. Sub-byte vector with NumElements requires exactly vec.size() bytes."
            );
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<T> UnPackSubByteVecImpl(const std::vector<uint8_t>& vec, size_t numElements)
{
    std::vector<T> ret(numElements);
    MILVerifyIsTrue(
        vec.size() == MILBlob::SizeInBytes<T>(numElements),
        std::invalid_argument,
        "Unpacking to sub-byte type vector has invalid number of elements. Sub-byte vector with NumElements "
        "requires exactly vec.size() bytes.");
    Util::Span<T> subByteSpan((typename MILBlob::Util::voidType<T>::type)(vec.data()), numElements);
    for (size_t i = 0; i < numElements; i++) {
        ret[i] = subByteSpan.ValueAt(i);
    }
    return ret;
}